

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O1

BufferWithRandomAccess * __thiscall
wasm::BufferWithRandomAccess::operator<<(BufferWithRandomAccess *this,int64_t x)

{
  uchar local_20;
  uchar local_1f;
  uchar local_1e;
  uchar local_1d;
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  
  local_20 = (uchar)x;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_20);
  local_19 = (uchar)((ulong)x >> 8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  local_1f = (uchar)((ulong)x >> 0x10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1f);
  local_1e = (uchar)((ulong)x >> 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1e);
  local_1d = (uchar)((ulong)x >> 0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1d);
  local_1c = (uchar)((ulong)x >> 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1c);
  local_1b = (uchar)((ulong)x >> 0x30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1b);
  local_1a = (uchar)((ulong)x >> 0x38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1a);
  return this;
}

Assistant:

BufferWithRandomAccess& operator<<(int64_t x) {
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    return *this;
  }